

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::FunctionalTest::prepareDstPxls
          (FunctionalTest *this,targetDesc *desc,GLubyte **out_pixels)

{
  long lVar1;
  GLenum internal_format;
  GLenum type;
  bool bVar2;
  GLuint GVar3;
  GLubyte *pGVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  GLuint depths [3];
  GLuint widths [3];
  GLuint heights [3];
  
  internal_format = desc->m_internal_format;
  bVar2 = Utils::isTargetMultilevel(desc->m_target);
  GVar3 = Utils::getPixelSizeForFormat(internal_format);
  type = desc->m_type;
  calculateDimmensions
            ((FunctionalTest *)heights,desc->m_target,desc->m_level,desc->m_width,desc->m_height,
             widths,heights,depths);
  lVar1 = (ulong)bVar2 * 2 + 1;
  for (lVar5 = 0; lVar1 != lVar5; lVar5 = lVar5 + 1) {
    uVar6 = (ulong)(widths[lVar5] * GVar3 * heights[lVar5] * depths[lVar5]);
    pGVar4 = (GLubyte *)operator_new__(uVar6);
    out_pixels[lVar5] = pGVar4;
    memset(pGVar4,0,uVar6);
  }
  for (lVar5 = 0; lVar5 != lVar1; lVar5 = lVar5 + 1) {
    pGVar4 = out_pixels[lVar5];
    uVar6 = (ulong)(widths[lVar5] * depths[lVar5] * heights[lVar5]);
    uVar7 = 0;
    while (bVar2 = uVar6 != 0, uVar6 = uVar6 - 1, bVar2) {
      Utils::packPixel(internal_format,type,1.0,1.0,1.0,1.0,pGVar4 + uVar7);
      uVar7 = (ulong)((int)uVar7 + GVar3);
    }
  }
  return;
}

Assistant:

void FunctionalTest::prepareDstPxls(const FunctionalTest::targetDesc& desc, GLubyte** out_pixels) const
{
	const GLenum internal_format = desc.m_internal_format;
	const bool   is_multi_level  = Utils::isTargetMultilevel(desc.m_target);
	GLuint		 n_levels		 = 1;
	const GLuint pixel_size		 = Utils::getPixelSizeForFormat(desc.m_internal_format);
	const GLenum type			 = desc.m_type;

	/* Configure levels */
	if (true == is_multi_level)
	{
		n_levels = FUNCTIONAL_TEST_N_LEVELS;
	}

	/* Calculate dimmensions */
	GLuint heights[FUNCTIONAL_TEST_N_LEVELS];
	GLuint widths[FUNCTIONAL_TEST_N_LEVELS];
	GLuint depths[FUNCTIONAL_TEST_N_LEVELS];

	calculateDimmensions(desc.m_target, desc.m_level, desc.m_width, desc.m_height, widths, heights, depths);

	/* Prepare storage */
	for (GLuint i = 0; i < n_levels; ++i)
	{
		const GLuint req_memory_per_layer = pixel_size * widths[i] * heights[i];
		const GLuint req_memory_for_level = req_memory_per_layer * depths[i];

		out_pixels[i] = new GLubyte[req_memory_for_level];

		if (0 == out_pixels[i])
		{
			TCU_FAIL("Memory allocation failed");
		}

		memset(out_pixels[i], 0, req_memory_for_level);
	}

	/* Fill pixels */
	for (GLuint i = 0; i < n_levels; ++i)
	{
		const GLuint n_layers = depths[i];
		const GLuint n_pixels = widths[i] * heights[i];
		GLubyte*	 ptr	  = (GLubyte*)out_pixels[i];

		for (GLuint j = 0; j < n_pixels * n_layers; ++j)
		{
			GLubyte* pixel_data = ptr + j * pixel_size;

			Utils::packPixel(internal_format, type, 1.0, 1.0, 1.0, 1.0, pixel_data);
		}
	}
}